

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int clearDatabasePage(BtShared *pBt,Pgno pgno,int freePageFlag,int *pnChange)

{
  u8 uVar1;
  u8 uVar2;
  ushort uVar3;
  u8 *puVar4;
  BtShared *pBt_00;
  Pgno PVar5;
  int iVar6;
  u32 uVar7;
  int local_44;
  int i;
  uchar *pCell;
  MemPage *pMStack_30;
  int rc;
  MemPage *pPage;
  int *pnChange_local;
  int freePageFlag_local;
  Pgno pgno_local;
  BtShared *pBt_local;
  
  pPage = (MemPage *)pnChange;
  pnChange_local._0_4_ = freePageFlag;
  pnChange_local._4_4_ = pgno;
  _freePageFlag_local = pBt;
  PVar5 = btreePagecount(pBt);
  if (PVar5 < pgno) {
    iVar6 = sqlite3CorruptError(0xde4a);
    return iVar6;
  }
  iVar6 = getAndInitPage(_freePageFlag_local,pnChange_local._4_4_,&stack0xffffffffffffffd0,0);
  if (iVar6 != 0) {
    return iVar6;
  }
  pCell._4_4_ = 0;
  for (local_44 = 0; pBt_00 = _freePageFlag_local, local_44 < (int)(uint)pMStack_30->nCell;
      local_44 = local_44 + 1) {
    puVar4 = pMStack_30->aData;
    uVar3 = pMStack_30->maskPage;
    uVar1 = pMStack_30->aCellIdx[local_44 << 1];
    uVar2 = pMStack_30->aCellIdx[(long)(local_44 << 1) + 1];
    if (pMStack_30->leaf == '\0') {
      uVar7 = sqlite3Get4byte(puVar4 + (int)(uint)(uVar3 & CONCAT11(uVar1,uVar2)));
      pCell._4_4_ = clearDatabasePage(pBt_00,uVar7,1,(int *)pPage);
      if (pCell._4_4_ != 0) goto LAB_001abc96;
      pCell._4_4_ = 0;
    }
    pCell._4_4_ = clearCell(pMStack_30,puVar4 + (int)(uint)(uVar3 & CONCAT11(uVar1,uVar2)));
    if (pCell._4_4_ != 0) goto LAB_001abc96;
  }
  if (pMStack_30->leaf == '\0') {
    uVar7 = sqlite3Get4byte(pMStack_30->aData + 8);
    pCell._4_4_ = clearDatabasePage(pBt_00,uVar7,1,(int *)pPage);
    if (pCell._4_4_ != 0) goto LAB_001abc96;
  }
  else if (pPage != (MemPage *)0x0) {
    *(uint *)pPage = (uint)pMStack_30->nCell + *(int *)pPage;
  }
  if ((int)pnChange_local == 0) {
    pCell._4_4_ = sqlite3PagerWrite(pMStack_30->pDbPage);
    if (pCell._4_4_ == 0) {
      zeroPage(pMStack_30,*pMStack_30->aData | 8);
    }
  }
  else {
    freePage(pMStack_30,(int *)((long)&pCell + 4));
  }
LAB_001abc96:
  releasePage(pMStack_30);
  return pCell._4_4_;
}

Assistant:

static int clearDatabasePage(
  BtShared *pBt,           /* The BTree that contains the table */
  Pgno pgno,               /* Page number to clear */
  int freePageFlag,        /* Deallocate page if true */
  int *pnChange            /* Add number of Cells freed to this counter */
){
  MemPage *pPage;
  int rc;
  unsigned char *pCell;
  int i;

  assert( sqlite3_mutex_held(pBt->mutex) );
  if( pgno>btreePagecount(pBt) ){
    return SQLITE_CORRUPT_BKPT;
  }

  rc = getAndInitPage(pBt, pgno, &pPage, 0);
  if( rc ) return rc;
  for(i=0; i<pPage->nCell; i++){
    pCell = findCell(pPage, i);
    if( !pPage->leaf ){
      rc = clearDatabasePage(pBt, get4byte(pCell), 1, pnChange);
      if( rc ) goto cleardatabasepage_out;
    }
    rc = clearCell(pPage, pCell);
    if( rc ) goto cleardatabasepage_out;
  }
  if( !pPage->leaf ){
    rc = clearDatabasePage(pBt, get4byte(&pPage->aData[8]), 1, pnChange);
    if( rc ) goto cleardatabasepage_out;
  }else if( pnChange ){
    assert( pPage->intKey );
    *pnChange += pPage->nCell;
  }
  if( freePageFlag ){
    freePage(pPage, &rc);
  }else if( (rc = sqlite3PagerWrite(pPage->pDbPage))==0 ){
    zeroPage(pPage, pPage->aData[0] | PTF_LEAF);
  }

cleardatabasepage_out:
  releasePage(pPage);
  return rc;
}